

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

Array<capnp::Orphan<capnp::compiler::Statement>_> * __thiscall
kj::ArrayBuilder<capnp::Orphan<capnp::compiler::Statement>_>::finish
          (ArrayBuilder<capnp::Orphan<capnp::compiler::Statement>_> *this)

{
  Orphan<capnp::compiler::Statement> *pOVar1;
  RemoveConst<capnp::Orphan<capnp::compiler::Statement>_> *pRVar2;
  ArrayDisposer *pAVar3;
  Array<capnp::Orphan<capnp::compiler::Statement>_> *result;
  Array<capnp::Orphan<capnp::compiler::Statement>_> *in_RDI;
  
  pOVar1 = this->ptr;
  pRVar2 = this->pos;
  pAVar3 = this->disposer;
  in_RDI->ptr = pOVar1;
  in_RDI->size_ = (long)pRVar2 - (long)pOVar1 >> 5;
  in_RDI->disposer = pAVar3;
  this->ptr = (Orphan<capnp::compiler::Statement> *)0x0;
  this->pos = (RemoveConst<capnp::Orphan<capnp::compiler::Statement>_> *)0x0;
  this->endPtr = (Orphan<capnp::compiler::Statement> *)0x0;
  return in_RDI;
}

Assistant:

Array<T> finish() {
    // We could safely remove this check if we assume that the disposer implementation doesn't
    // need to know the original capacity, as is the case with HeapArrayDisposer since it uses
    // operator new() or if we created a custom disposer for ArrayBuilder which stores the capacity
    // in a prefix.  But that would make it hard to write cleverer heap allocators, and anyway this
    // check might catch bugs.  Probably people should use Vector if they want to build arrays
    // without knowing the final size in advance.
    KJ_IREQUIRE(pos == endPtr, "ArrayBuilder::finish() called prematurely.");
    Array<T> result(reinterpret_cast<T*>(ptr), pos - ptr, *disposer);
    ptr = nullptr;
    pos = nullptr;
    endPtr = nullptr;
    return result;
  }